

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_ssse3.c
# Opt level: O2

uint32_t adler32_ssse3(uint32_t adler,uint8_t *buf,size_t len)

{
  undefined1 *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint sum2;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  int iVar21;
  int iVar22;
  undefined1 auVar20 [16];
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  uVar4 = adler & 0xffff;
  sum2 = adler >> 0x10;
  if (len == 1) {
    uVar4 = uVar4 + *buf;
    uVar19 = uVar4 - 0xfff1;
    if (uVar4 < 0xfff1) {
      uVar19 = uVar4;
    }
    return ((sum2 + uVar19) % 0xfff1) * 0x10000 + uVar19;
  }
  if (buf == (uint8_t *)0x0) {
    return 1;
  }
  if (0xf < len) {
    uVar5 = 0x15b0;
    uVar3 = (ulong)((uint)buf & 0xf);
    if (((ulong)buf & 0xf) == 0) goto LAB_0010cf5e;
    if (0x20 - uVar3 <= len) {
      lVar7 = uVar3 - 0x10;
      while( true ) {
        if (lVar7 == 0) break;
        puVar1 = *(undefined1 (*) [16])buf;
        buf = *(undefined1 (*) [16])buf + 1;
        uVar4 = uVar4 + (byte)*puVar1;
        sum2 = sum2 + uVar4;
        lVar7 = lVar7 + 1;
      }
      len = len - (0x10 - uVar3);
      uVar5 = uVar3 | 0x15a0;
      goto LAB_0010cf5e;
    }
    len = len - 0x10;
    iVar9 = 0;
    iVar11 = 0;
    iVar13 = 0;
    iVar14 = 0;
    iVar15 = 0;
    iVar16 = 0;
    iVar17 = 0;
    uVar3 = 0;
    iVar8 = 0;
    iVar10 = 0;
    iVar12 = 0;
    do {
      auVar20 = psadbw((undefined1  [16])0x0,*(undefined1 (*) [16])buf);
      uVar19 = auVar20._0_4_ + uVar4;
      iVar21 = auVar20._4_4_ + iVar8;
      iVar22 = auVar20._8_4_ + iVar10;
      iVar23 = auVar20._12_4_ + iVar12;
      auVar20 = pmaddubsw(*(undefined1 (*) [16])buf,_DAT_00119c20);
      auVar20 = pmaddwd(auVar20,_DAT_00119c30);
      iVar14 = iVar14 + uVar4;
      iVar15 = iVar15 + iVar8;
      iVar16 = iVar16 + iVar10;
      iVar17 = iVar17 + iVar12;
      sum2 = sum2 + auVar20._0_4_;
      iVar9 = iVar9 + auVar20._4_4_;
      iVar11 = iVar11 + auVar20._8_4_;
      iVar13 = iVar13 + auVar20._12_4_;
      buf = (uint8_t *)((long)buf + 0x10);
      for (; uVar3 < 0x10; uVar3 = uVar3 - (uVar5 & 0xffffffffffffffe0)) {
        auVar20._0_4_ = sum2 + iVar14 * 0x10;
        auVar20._4_4_ = iVar9 + iVar15 * 0x10;
        auVar20._8_4_ = iVar11 + iVar16 * 0x10;
        auVar20._12_4_ = iVar13 + iVar17 * 0x10;
        auVar20 = phaddd(auVar20,auVar20);
        uVar4 = (iVar22 + uVar19) % 0xfff1;
        auVar20 = phaddd(auVar20,auVar20);
        sum2 = auVar20._0_4_ % 0xfff1;
        uVar5 = 0x15b0;
LAB_0010cf5e:
        if (len < 0x10) goto LAB_0010d028;
        if (len < uVar5) {
          uVar5 = len;
        }
        iVar8 = 0;
        iVar10 = 0;
        iVar12 = 0;
        uVar3 = uVar5 & 0xfffffffffffffff0;
        puVar1 = *(undefined1 (*) [16])buf;
        iVar9 = 0;
        iVar11 = 0;
        iVar13 = 0;
        iVar14 = 0;
        iVar15 = 0;
        iVar16 = 0;
        iVar17 = 0;
        iVar18 = 0;
        uVar6 = uVar3;
        uVar19 = uVar4;
        iVar21 = 0;
        iVar22 = 0;
        iVar23 = 0;
        while (0x1f < uVar6) {
          uVar6 = uVar6 - 0x20;
          auVar25 = psadbw(*(undefined1 (*) [16])buf,(undefined1  [16])0x0);
          auVar26 = psadbw(*(undefined1 (*) [16])((long)buf + 0x10),(undefined1  [16])0x0);
          iVar9 = iVar9 + uVar19;
          iVar11 = iVar11 + iVar21;
          iVar13 = iVar13 + iVar22;
          iVar14 = iVar14 + iVar23;
          auVar20 = pmaddubsw(*(undefined1 (*) [16])buf,_DAT_00119c40);
          auVar20 = pmaddwd(auVar20,_DAT_00119c30);
          auVar24 = pmaddubsw(*(undefined1 (*) [16])((long)buf + 0x10),_DAT_00119c20);
          sum2 = sum2 + auVar20._0_4_;
          iVar8 = iVar8 + auVar20._4_4_;
          iVar10 = iVar10 + auVar20._8_4_;
          iVar12 = iVar12 + auVar20._12_4_;
          auVar20 = pmaddwd(auVar24,_DAT_00119c30);
          iVar15 = iVar15 + auVar20._0_4_;
          iVar16 = iVar16 + auVar20._4_4_;
          iVar17 = iVar17 + auVar20._8_4_;
          iVar18 = iVar18 + auVar20._12_4_;
          buf = (uint8_t *)((long)buf + 0x20);
          uVar19 = auVar25._0_4_ + uVar19 + auVar26._0_4_;
          iVar21 = auVar25._4_4_ + iVar21 + auVar26._4_4_;
          iVar22 = auVar25._8_4_ + iVar22 + auVar26._8_4_;
          iVar23 = auVar25._12_4_ + iVar23 + auVar26._12_4_;
        }
        len = len - uVar3;
        sum2 = sum2 + iVar15 + iVar9 * 0x20;
        iVar9 = iVar8 + iVar16 + iVar11 * 0x20;
        iVar11 = iVar10 + iVar17 + iVar13 * 0x20;
        iVar13 = iVar12 + iVar18 + iVar14 * 0x20;
        iVar14 = 0;
        iVar15 = 0;
        iVar16 = 0;
        iVar17 = 0;
        buf = (uint8_t *)(puVar1 + (uVar5 & 0xffffffffffffffe0));
      }
      uVar3 = uVar3 - 0x10;
      uVar4 = uVar19;
      iVar8 = iVar21;
      iVar10 = iVar22;
      iVar12 = iVar23;
    } while( true );
  }
LAB_0010d028:
  uVar2 = adler32_len_16(uVar4,buf,len,sum2);
  return uVar2;
}

Assistant:

Z_INTERNAL uint32_t adler32_ssse3(uint32_t adler, const uint8_t *buf, size_t len) {
    uint32_t sum2;

     /* split Adler-32 into component sums */
    sum2 = (adler >> 16) & 0xffff;
    adler &= 0xffff;

    /* in case user likes doing a byte at a time, keep it fast */
    if (UNLIKELY(len == 1))
        return adler32_len_1(adler, buf, sum2);

    /* initial Adler-32 value (deferred check for len == 1 speed) */
    if (UNLIKELY(buf == NULL))
        return 1L;

    /* in case short lengths are provided, keep it somewhat fast */
    if (UNLIKELY(len < 16))
        return adler32_len_16(adler, buf, len, sum2);

    const __m128i dot2v = _mm_setr_epi8(32, 31, 30, 29, 28, 27, 26, 25, 24, 23, 22, 21, 20, 19, 18, 17);
    const __m128i dot2v_0 = _mm_setr_epi8(16, 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1);
    const __m128i dot3v = _mm_set1_epi16(1);
    const __m128i zero = _mm_setzero_si128();

    __m128i vbuf, vs1_0, vs3, vs1, vs2, vs2_0, v_sad_sum1, v_short_sum2, v_short_sum2_0,
            vbuf_0, v_sad_sum2, vsum2, vsum2_0;

    /* If our buffer is unaligned (likely), make the determination whether
     * or not there's enough of a buffer to consume to make the scalar, aligning
     * additions worthwhile or if it's worth it to just eat the cost of an unaligned
     * load. This is a pretty simple test, just test if 16 - the remainder + len is
     * < 16 */
    size_t max_iters = NMAX;
    size_t rem = (uintptr_t)buf & 15;
    size_t align_offset = 16 - rem;
    size_t k = 0;
    if (rem) {
        if (len < 16 + align_offset) {
            /* Let's eat the cost of this one unaligned load so that
             * we don't completely skip over the vectorization. Doing
             * 16 bytes at a time unaligned is better than 16 + <= 15
             * sums */
            vbuf = _mm_loadu_si128((__m128i*)buf);
            len -= 16;
            buf += 16;
            vs1 = _mm_cvtsi32_si128(adler);
            vs2 = _mm_cvtsi32_si128(sum2);
            vs3 = _mm_setzero_si128();
            vs1_0 = vs1;
            goto unaligned_jmp;
        }

        for (size_t i = 0; i < align_offset; ++i) {
            adler += *(buf++);
            sum2 += adler;
        }

        /* lop off the max number of sums based on the scalar sums done
         * above */
        len -= align_offset;
        max_iters -= align_offset;
    }


    while (len >= 16) {
        vs1 = _mm_cvtsi32_si128(adler);
        vs2 = _mm_cvtsi32_si128(sum2);
        vs3 = _mm_setzero_si128();
        vs2_0 = _mm_setzero_si128();
        vs1_0 = vs1;

        k = (len < max_iters ? len : max_iters);
        k -= k % 16;
        len -= k;

        while (k >= 32) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_load_si128((__m128i*)buf);
            vbuf_0 = _mm_load_si128((__m128i*)(buf + 16));
            buf += 32;
            k -= 32;

            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            v_sad_sum2 = _mm_sad_epu8(vbuf_0, zero);
            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);

            vs1 = _mm_add_epi32(v_sad_sum2, vs1);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            v_short_sum2_0 = _mm_maddubs_epi16(vbuf_0, dot2v_0);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vsum2_0 = _mm_madd_epi16(v_short_sum2_0, dot3v);
            vs2_0 = _mm_add_epi32(vsum2_0, vs2_0);
            vs1_0 = vs1;
        }

        vs2 = _mm_add_epi32(vs2_0, vs2);
        vs3 = _mm_slli_epi32(vs3, 5);
        vs2 = _mm_add_epi32(vs3, vs2);
        vs3 = _mm_setzero_si128();

        while (k >= 16) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_load_si128((__m128i*)buf);
            buf += 16;
            k -= 16;

unaligned_jmp:
            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v_0);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vs1_0 = vs1;
        }

        vs3 = _mm_slli_epi32(vs3, 4);
        vs2 = _mm_add_epi32(vs2, vs3);

        /* We don't actually need to do a full horizontal sum, since psadbw is actually doing
         * a partial reduction sum implicitly and only summing to integers in vector positions
         * 0 and 2. This saves us some contention on the shuffle port(s) */
        adler = partial_hsum(vs1) % BASE;
        sum2 = hsum(vs2) % BASE;
        max_iters = NMAX;
    }

    /* Process tail (len < 16).  */
    return adler32_len_16(adler, buf, len, sum2);
}